

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_hash.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__ptr;
  undefined1 local_168 [8];
  option long_options [9];
  int local_3c;
  int opt;
  int cost;
  char *algo;
  char *hash;
  char *salt;
  char *password;
  char **argv_local;
  int argc_local;
  
  salt = (char *)0x0;
  hash = (char *)0x0;
  local_3c = 10;
  memcpy(local_168,&PTR_anon_var_dwarf_41_0010bcb0,0x120);
  msgno = 0;
  do {
    iVar1 = getopt_long(argc,argv,"p:a:s:c:vqVH",local_168,0);
    if (iVar1 == -1) {
      __ptr = password_hash(salt,"bcrypt",hash,local_3c);
      if (__ptr == (char *)0x0) {
        argv_local._4_4_ = -1;
      }
      else {
        printf("%s\n",__ptr);
        free(__ptr);
        argv_local._4_4_ = 0;
      }
      return argv_local._4_4_;
    }
    switch(iVar1) {
    case 0x48:
    default:
      usage(*argv);
      return -1;
    case 0x56:
      printf("PHP Password Hashing version: %d.%d.%d\n",0,1);
      return 0;
    case 0x61:
      break;
    case 99:
      local_3c = atoi(_optarg);
      break;
    case 0x70:
      salt = _optarg;
      break;
    case 0x71:
      msgno = -1;
      break;
    case 0x73:
      hash = _optarg;
      break;
    case 0x76:
      if (_optarg == (char *)0x0) {
        msgno = msgno + 1;
      }
      else {
        msgno = atoi(_optarg);
      }
    }
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
    char *password = NULL, *salt = NULL;
    char *hash = NULL;
    char *algo = BCRYPT_BLOWFISH;
    int cost = BCRYPT_BLOWFISH_COST;

    int opt;
    const struct option long_options[] = {
        { "password", 1, NULL, 'p' },
        { "algorithm", 1, NULL, 'a' },
        { "salt", 1, NULL, 's' },
        { "cost", 1, NULL, 'c' },
        { "verbose", 1, NULL, 'v' },
        { "quiet", 0, NULL, 'q' },
        { "version", 0, NULL, 'V' },
        { "help", 0, NULL, 'H' },
        { NULL, 0, NULL, 0 }
    };

    msgno = 0;

    while ((opt = getopt_long(argc, argv, "p:a:s:c:vqVH",
                              long_options, NULL)) != -1) {
        switch (opt) {
            case 'p':
                password = optarg;
                break;
            case 'a':
                break;
            case 's':
                salt = optarg;
                break;
            case 'c':
                cost = atoi(optarg);
                break;
            case 'v':
                if (optarg) {
                    msgno = atoi(optarg);
                } else {
                    msgno += 1;
                }
                break;
            case 'q':
                msgno = -1;
                break;
            case 'V':
                printf("PHP Password Hashing version: %d.%d.%d\n",
                       PHP_PASSWORD_VERSION_MAJOR,
                       PHP_PASSWORD_VERSION_MINOR,
                       PHP_PASSWORD_VERSION_BUILD);
                return 0;
            case 'H':
            default:
                usage(argv[0]);
                return -1;
        }
    }

    hash = password_hash(password, algo, salt, cost);
    if (!hash) {
        return -1;
    }

    printf("%s\n", hash);

    free(hash);

    return 0;
}